

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

int run_container_negation_range_inplace
              (run_container_t *src,int range_start,int range_end,container_t **dst)

{
  uint uVar1;
  rle16_t *prVar2;
  container_t *pcVar3;
  ushort uVar4;
  uint16_t start;
  uint16_t length;
  uint16_t length_00;
  ushort start_00;
  ushort uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint8_t return_typecode;
  byte local_49;
  run_container_t *local_48;
  container_t **local_40;
  ulong local_38;
  
  if (range_end <= range_start) {
    *dst = src;
    return 3;
  }
  uVar1 = src->n_runs;
  uVar8 = src->capacity;
  start_00 = (ushort)range_start;
  uVar4 = (ushort)range_end;
  if (uVar8 == uVar1) {
    if (range_start < 1) {
      prVar2 = src->runs;
LAB_0010e497:
      iVar6 = 0;
    }
    else {
      prVar2 = src->runs;
      if ((int)uVar8 < 1) goto LAB_0010e497;
      iVar6 = uVar8 - 1;
      uVar10 = 0;
      do {
        uVar9 = iVar6 + uVar10 >> 1;
        uVar5 = (ushort)(range_start - 1U);
        if (prVar2[uVar9].value < uVar5) {
          uVar10 = uVar9 + 1;
        }
        else {
          if (prVar2[uVar9].value <= uVar5) {
            iVar6 = 1;
            goto LAB_0010e499;
          }
          iVar6 = uVar9 - 1;
        }
      } while ((int)uVar10 <= iVar6);
      if ((uVar10 == 0) ||
         (iVar6 = 1,
         (int)(uint)prVar2[(ulong)uVar10 - 1].length <
         (int)((range_start - 1U & 0xffff) - (uint)prVar2[(ulong)uVar10 - 1].value)))
      goto LAB_0010e497;
    }
LAB_0010e499:
    if ((int)uVar8 < 1) {
LAB_0010e4ed:
      iVar7 = 0;
    }
    else {
      iVar7 = uVar8 - 1;
      uVar10 = 0;
      do {
        uVar9 = iVar7 + uVar10 >> 1;
        if (prVar2[uVar9].value < start_00) {
          uVar10 = uVar9 + 1;
        }
        else {
          if (prVar2[uVar9].value <= start_00) {
            iVar7 = 1;
            goto LAB_0010e4f8;
          }
          iVar7 = uVar9 - 1;
        }
      } while ((int)uVar10 <= iVar7);
      if ((uVar10 == 0) ||
         (iVar7 = 1,
         (int)(uint)prVar2[(ulong)uVar10 - 1].length <
         (int)((range_start & 0xffffU) - (uint)prVar2[(ulong)uVar10 - 1].value))) goto LAB_0010e4ed;
    }
LAB_0010e4f8:
    if (iVar6 == iVar7) {
      if ((int)uVar8 < 1) {
LAB_0010e557:
        iVar6 = 0;
      }
      else {
        iVar6 = uVar8 - 1;
        uVar10 = 0;
        do {
          uVar9 = iVar6 + uVar10 >> 1;
          uVar5 = (ushort)(range_end - 1U);
          if (prVar2[uVar9].value < uVar5) {
            uVar10 = uVar9 + 1;
          }
          else {
            if (prVar2[uVar9].value <= uVar5) {
              iVar6 = 1;
              goto LAB_0010e56a;
            }
            iVar6 = uVar9 - 1;
          }
        } while ((int)uVar10 <= iVar6);
        if ((uVar10 == 0) ||
           (iVar6 = 1,
           (int)(uint)prVar2[(ulong)uVar10 - 1].length <
           (int)((range_end - 1U & 0xffff) - (uint)prVar2[(ulong)uVar10 - 1].value)))
        goto LAB_0010e557;
      }
LAB_0010e56a:
      iVar7 = 0;
      if (range_end != 0x10000) {
        if (0 < (int)uVar8) {
          iVar7 = uVar8 - 1;
          uVar8 = 0;
          do {
            uVar10 = iVar7 + uVar8 >> 1;
            if (prVar2[uVar10].value < uVar4) {
              uVar8 = uVar10 + 1;
            }
            else {
              if (prVar2[uVar10].value <= uVar4) {
                iVar7 = 1;
                goto LAB_0010e5d0;
              }
              iVar7 = uVar10 - 1;
            }
          } while ((int)uVar8 <= iVar7);
          if ((uVar8 != 0) &&
             (iVar7 = 1,
             (int)((range_end & 0xffffU) - (uint)prVar2[(ulong)uVar8 - 1].value) <=
             (int)(uint)prVar2[(ulong)uVar8 - 1].length)) goto LAB_0010e5d0;
        }
        iVar7 = 0;
      }
LAB_0010e5d0:
      if (iVar7 == iVar6) {
        uVar1 = run_container_negation_range(src,range_start,range_end,dst);
        goto LAB_0010e6d0;
      }
    }
  }
  src->n_runs = 0;
  if ((int)uVar1 < 1) {
    uVar11 = 0;
  }
  else {
    uVar11 = 0;
    do {
      start = src->runs[uVar11].value;
      if (range_start <= (int)(uint)start) {
        length = src->runs[uVar11].length;
        goto LAB_0010e626;
      }
      uVar11 = uVar11 + 1;
      src->n_runs = (int32_t)uVar11;
    } while (uVar1 != uVar11);
    uVar11 = (ulong)uVar1;
  }
  start = 0;
  length = 0;
LAB_0010e626:
  run_container_smart_append_exclusive(src,start_00,~start_00 + uVar4);
  if ((int)uVar11 < (int)uVar1) {
    iVar6 = (int)uVar11 + 1;
    local_48 = src;
    local_40 = dst;
    if (iVar6 < (int)uVar1) {
      uVar11 = uVar11 & 0xffffffff;
      length_00 = length;
      local_38 = (ulong)uVar1;
      uVar4 = start;
      do {
        start = local_48->runs[uVar11 + 1].value;
        length = local_48->runs[uVar11 + 1].length;
        run_container_smart_append_exclusive(local_48,uVar4,length_00);
        iVar6 = iVar6 + 1;
        uVar11 = uVar11 + 1;
        length_00 = length;
        uVar4 = start;
      } while (iVar6 < (int)local_38);
    }
    src = local_48;
    run_container_smart_append_exclusive(local_48,start,length);
    dst = local_40;
  }
  pcVar3 = convert_run_to_efficient_container(src,&local_49);
  *dst = pcVar3;
  uVar1 = (uint)local_49;
  if (uVar1 == 3) {
    return 3;
  }
LAB_0010e6d0:
  run_container_free(src);
  return uVar1;
}

Assistant:

int run_container_negation_range_inplace(
    run_container_t *src,
    const int range_start, const int range_end,
    container_t **dst
){
    uint8_t return_typecode;

    if (range_end <= range_start) {
        *dst = src;
        return RUN_CONTAINER_TYPE;
    }

    // TODO: efficient special case when range is 0 to 65535 inclusive

    if (src->capacity == src->n_runs) {
        // no excess room.  More checking to see if result can fit
        bool last_val_before_range = false;
        bool first_val_in_range = false;
        bool last_val_in_range = false;
        bool first_val_past_range = false;

        if (range_start > 0)
            last_val_before_range =
                run_container_contains(src, (uint16_t)(range_start - 1));
        first_val_in_range = run_container_contains(src, (uint16_t)range_start);

        if (last_val_before_range == first_val_in_range) {
            last_val_in_range =
                run_container_contains(src, (uint16_t)(range_end - 1));
            if (range_end != 0x10000)
                first_val_past_range =
                    run_container_contains(src, (uint16_t)range_end);

            if (last_val_in_range ==
                first_val_past_range) {  // no space for inplace
                int ans = run_container_negation_range(src, range_start,
                                                       range_end, dst);
                run_container_free(src);
                return ans;
            }
        }
    }
    // all other cases: result will fit

    run_container_t *ans = src;
    int my_nbr_runs = src->n_runs;

    ans->n_runs = 0;
    int k = 0;
    for (; (k < my_nbr_runs) && (src->runs[k].value < range_start); ++k) {
        // ans->runs[k] = src->runs[k]; (would be self-copy)
        ans->n_runs++;
    }

    // as with Java implementation, use locals to give self a buffer of depth 1
    rle16_t buffered = MAKE_RLE16(0, 0);
    rle16_t next = buffered;
    if (k < my_nbr_runs) buffered = src->runs[k];

    run_container_smart_append_exclusive(
        ans, (uint16_t)range_start, (uint16_t)(range_end - range_start - 1));

    for (; k < my_nbr_runs; ++k) {
        if (k + 1 < my_nbr_runs) next = src->runs[k + 1];

        run_container_smart_append_exclusive(ans, buffered.value,
                                             buffered.length);
        buffered = next;
    }

    *dst = convert_run_to_efficient_container(ans, &return_typecode);
    if (return_typecode != RUN_CONTAINER_TYPE) run_container_free(ans);

    return return_typecode;
}